

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::Print<char>::operator()
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Print<char> *this,mode *first,
          priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *args)

{
  int iVar1;
  conditional_t<std::is_same_v<char,_char>,_const_std::basic_string<char>_&,_std::basic_string<char>_>
  pbVar2;
  allocator<char> local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *local_28;
  priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *args_local;
  mode *first_local;
  Print<char> *this_local;
  
  local_28 = args;
  args_local = (priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *)first
  ;
  first_local = (mode *)this;
  this_local = (Print<char> *)__return_storage_ptr__;
  if (*first == str) {
    if (operator()<std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>(ptc::mode&&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&)
        ::oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>(ptc::mode&&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&)
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &operator()<std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>(ptc::mode&&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&)
                    ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                     &operator()<std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>(ptc::mode&&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&)
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>(ptc::mode&&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&)
                             ::oss_abi_cxx11_);
      }
    }
    s_abi_cxx11_(&local_58,"",0);
    anon_unknown_8::StringConverter<char>(&local_58);
    std::__cxx11::ostringstream::str
              ((string *)
               &operator()<std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>(ptc::mode&&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&)
                ::oss_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_58);
    std::ios::clear((int)*(undefined8 *)
                          (operator()<std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>(ptc::mode&&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&)
                           ::oss_abi_cxx11_ + -0x18) + 0x1b2fa0);
    print_backend<std::__cxx11::ostringstream&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>
              (this,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &operator()<std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&>(ptc::mode&&,std::priority_queue<int,std::vector<int,std::allocator<int>>,std::less<int>>&)
                     ::oss_abi_cxx11_,local_28);
    std::__cxx11::ostringstream::str();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    pbVar2 = anon_unknown_8::StringConverter<char>(&local_78);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }